

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O2

void __thiscall t_d_generator::generate_typedef(t_d_generator *this,t_typedef *ttypedef)

{
  ostream *poVar1;
  t_type *ttype;
  string local_60;
  string local_40;
  
  emit_doc(this,(t_doc *)ttypedef,(ostream *)&this->f_types_);
  t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
  poVar1 = std::operator<<((ostream *)&this->f_types_,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,"alias ");
  ttype = t_typedef::get_type(ttypedef);
  render_type_name_abi_cxx11_(&local_60,this,ttype,false);
  poVar1 = std::operator<<(poVar1,(string *)&local_60);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)&ttypedef->symbolic_);
  poVar1 = std::operator<<(poVar1,";");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void generate_typedef(t_typedef* ttypedef) override {
    this->emit_doc(ttypedef, f_types_);
    f_types_ << indent() << "alias " << render_type_name(ttypedef->get_type()) << " "
             << ttypedef->get_symbolic() << ";" << endl << endl;
  }